

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_streams.c
# Opt level: O1

HPDF_STATUS HPDF_Stream_WriteToStreamWithDeflate(HPDF_Stream src,HPDF_Stream dst,HPDF_Encrypt e)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  HPDF_STATUS HVar4;
  HPDF_BYTE *pHVar5;
  HPDF_Error error;
  HPDF_UINT len;
  bool bVar6;
  HPDF_UINT size;
  z_stream strm;
  Bytef inbuf [4096];
  undefined1 auStack_3428 [12];
  HPDF_UINT local_341c;
  undefined1 *local_3418;
  HPDF_STATUS local_3410;
  ulong local_3408;
  HPDF_Stream local_3400;
  HPDF_BYTE *local_33f8;
  HPDF_UINT local_33f0;
  HPDF_BYTE *local_33e0;
  uint local_33d8;
  HPDF_BYTE local_3388 [4096];
  HPDF_BYTE local_2388 [4528];
  HPDF_BYTE local_11d8 [4520];
  
  local_3400 = dst;
  HVar4 = HPDF_Stream_Seek(src,0,HPDF_SEEK_SET);
  if (HVar4 == 0) {
    local_3418 = auStack_3428;
    HPDF_MemSet(&local_33f8,'\0',0x70);
    local_33d8 = 0x11a6;
    local_33e0 = local_2388;
    iVar2 = deflateInit_(&local_33f8,0xffffffff,"1.2.11",0x70);
    if (iVar2 == 0) {
      local_3408 = 0;
      local_33f8 = local_3388;
      local_33f0 = 0;
      do {
        local_341c = 0x1000;
        if (src->read_fn == (HPDF_Stream_Read_Func)0x0) {
          HVar4 = HPDF_SetError(src->error,0x1035,0);
        }
        else {
          HVar4 = (*src->read_fn)(src,local_3388,&local_341c);
        }
        local_33f0 = local_341c;
        local_33f8 = local_3388;
        if (HVar4 == 0) {
LAB_00132ed7:
          if (local_33f0 != 0) {
            uVar3 = deflate(&local_33f8,0);
            if (uVar3 < 2) goto code_r0x00132ef1;
            HVar4 = (HPDF_STATUS)(int)uVar3;
            deflateEnd(&local_33f8);
            error = src->error;
            goto LAB_00132fa8;
          }
          bVar6 = (int)local_3408 != 0;
          local_3408 = (ulong)bVar6;
          cVar1 = bVar6 * '\x02';
        }
        else if (HVar4 == 0x1058) {
          local_3408 = 1;
          if (local_341c != 0) goto LAB_00132ed7;
          cVar1 = '\x02';
        }
        else {
          deflateEnd(&local_33f8);
          cVar1 = '\x01';
          local_3410 = HVar4;
        }
LAB_00132fbf:
      } while (cVar1 == '\0');
      HVar4 = local_3410;
      if (cVar1 == '\x02') {
        do {
          uVar3 = deflate(&local_33f8,4);
          if (1 < uVar3) {
            deflateEnd(&local_33f8);
            HVar4 = HPDF_SetError(src->error,0x1066,(long)(int)uVar3);
            return HVar4;
          }
          if (local_33d8 < 0x11a6) {
            len = 0x11a6 - local_33d8;
            pHVar5 = local_2388;
            if (e != (HPDF_Encrypt)0x0) {
              pHVar5 = local_11d8;
              HPDF_Encrypt_CryptBuf(e,local_2388,pHVar5,len);
            }
            HVar4 = HPDF_Stream_Write(local_3400,pHVar5,len);
            if (HVar4 != 0) {
              deflateEnd(&local_33f8);
              HVar4 = HPDF_SetError(src->error,0x1066,HVar4);
              return HVar4;
            }
            local_33e0 = local_2388;
            local_33d8 = 0x11a6;
          }
        } while (uVar3 != 1);
        deflateEnd(&local_33f8);
        HVar4 = 0;
      }
    }
    else {
      HVar4 = HPDF_SetError(src->error,0x1066,(long)iVar2);
    }
  }
  return HVar4;
code_r0x00132ef1:
  if (local_33d8 == 0) {
    pHVar5 = local_2388;
    if (e != (HPDF_Encrypt)0x0) {
      pHVar5 = local_11d8;
      HPDF_Encrypt_CryptBuf(e,local_2388,pHVar5,0x11a6);
    }
    HVar4 = HPDF_Stream_Write(local_3400,pHVar5,0x11a6);
    if (HVar4 != 0) {
      deflateEnd(&local_33f8);
      error = src->error;
LAB_00132fa8:
      local_3410 = HPDF_SetError(error,0x1066,HVar4);
      cVar1 = '\x01';
      goto LAB_00132fbf;
    }
    local_33d8 = 0x11a6;
    local_33e0 = local_2388;
  }
  goto LAB_00132ed7;
}

Assistant:

HPDF_STATUS
HPDF_Stream_WriteToStreamWithDeflate  (HPDF_Stream  src,
                                       HPDF_Stream  dst,
                                       HPDF_Encrypt  e)
{
#ifdef LIBHPDF_HAVE_ZLIB

#define DEFLATE_BUF_SIZ  ((HPDF_INT)(HPDF_STREAM_BUF_SIZ * 1.1) + 13)

    HPDF_STATUS ret;
    HPDF_BOOL flg;

    z_stream strm;
    Bytef inbuf[HPDF_STREAM_BUF_SIZ];
    Bytef otbuf[DEFLATE_BUF_SIZ];
    HPDF_BYTE ebuf[DEFLATE_BUF_SIZ];

    HPDF_PTRACE((" HPDF_Stream_WriteToStreamWithDeflate\n"));

    /* initialize input stream */
    ret = HPDF_Stream_Seek (src, 0, HPDF_SEEK_SET);
    if (ret != HPDF_OK)
        return ret;

    /* initialize decompression stream. */
    HPDF_MemSet(&strm, 0x00, sizeof(z_stream));
    strm.next_out = otbuf;
    strm.avail_out = DEFLATE_BUF_SIZ;

    ret = deflateInit_(&strm, Z_DEFAULT_COMPRESSION, ZLIB_VERSION,
            sizeof(z_stream));
    if (ret != Z_OK)
        return HPDF_SetError (src->error, HPDF_ZLIB_ERROR, ret);

    strm.next_in = inbuf;
    strm.avail_in = 0;

    flg = HPDF_FALSE;
    for (;;) {
        HPDF_UINT size = HPDF_STREAM_BUF_SIZ;

        ret = HPDF_Stream_Read (src, inbuf, &size);

        strm.next_in = inbuf;
        strm.avail_in = size;

        if (ret != HPDF_OK) {
            if (ret == HPDF_STREAM_EOF) {
                flg = HPDF_TRUE;
                if (size == 0)
                    break;
            } else {
                deflateEnd(&strm);
                return ret;
            }
        }

        while (strm.avail_in > 0) {
            ret = deflate(&strm, Z_NO_FLUSH);
            if (ret != Z_OK && ret != Z_STREAM_END) {
                deflateEnd(&strm);
                return HPDF_SetError (src->error, HPDF_ZLIB_ERROR, ret);
            }

            if (strm.avail_out == 0) {
                if (e) {
                    HPDF_Encrypt_CryptBuf (e, otbuf, ebuf, DEFLATE_BUF_SIZ);
                    ret = HPDF_Stream_Write(dst, ebuf, DEFLATE_BUF_SIZ);
                } else
                    ret = HPDF_Stream_Write (dst, otbuf, DEFLATE_BUF_SIZ);

                if (ret != HPDF_OK) {
                    deflateEnd(&strm);
                    return HPDF_SetError (src->error, HPDF_ZLIB_ERROR, ret);
                }

                strm.next_out = otbuf;
                strm.avail_out = DEFLATE_BUF_SIZ;
            }
        }

        if (flg)
            break;
    }

    flg = HPDF_FALSE;
    for (;;) {
        ret = deflate(&strm, Z_FINISH);
        if (ret != Z_OK && ret != Z_STREAM_END) {
            deflateEnd(&strm);
            return HPDF_SetError (src->error, HPDF_ZLIB_ERROR, ret);
        }

        if (ret == Z_STREAM_END)
            flg = HPDF_TRUE;

        if (strm.avail_out < DEFLATE_BUF_SIZ) {
            HPDF_UINT osize = DEFLATE_BUF_SIZ - strm.avail_out;
            if (e) {
                HPDF_Encrypt_CryptBuf (e, otbuf, ebuf, osize);
                ret = HPDF_Stream_Write(dst, ebuf, osize);
            } else
                ret = HPDF_Stream_Write (dst, otbuf, osize);

            if (ret != HPDF_OK) {
                deflateEnd(&strm);
                return HPDF_SetError (src->error, HPDF_ZLIB_ERROR, ret);
            }

            strm.next_out = otbuf;
            strm.avail_out = DEFLATE_BUF_SIZ;
        }

        if (flg)
            break;
    }

    deflateEnd(&strm);
    return HPDF_OK;
#else /* LIBHPDF_HAVE_ZLIB */
    HPDF_UNUSED (e);
    HPDF_UNUSED (dst);
    HPDF_UNUSED (src);
    return HPDF_UNSUPPORTED_FUNC;
#endif /* LIBHPDF_HAVE_ZLIB */
}